

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O0

void __thiscall
helics::MessageFederate::registerMessageInterfacesToml(MessageFederate *this,string *tomlString)

{
  string_view sinkName;
  string_view message;
  string_view message_00;
  string_view defVal;
  string_view type_00;
  string_view eptName_00;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  MessageFederate *this_00;
  undefined8 uVar4;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar5;
  size_t sVar6;
  array_type *paVar7;
  Endpoint *in_stack_000000e0;
  basic_value<toml::type_config> *in_stack_000000e8;
  MessageFederate *in_stack_000000f0;
  Endpoint *epObj_1;
  string key;
  basic_value<toml::type_config> *ept_1;
  iterator __end2_1;
  iterator __begin2_1;
  array_type *__range2_1;
  array_type *eptArray_1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *epts_1;
  Endpoint *epObj;
  bool targeted;
  bool global;
  string type;
  string eptName;
  basic_value<toml::type_config> *ept;
  iterator __end2;
  iterator __begin2;
  array_type *__range2;
  array_type *eptArray;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *epts;
  bool defaultTargeted;
  bool defaultGlobal;
  invalid_argument *ia;
  value doc;
  uint in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  MessageFederate *in_stack_fffffffffffffab0;
  Endpoint *in_stack_fffffffffffffab8;
  basic_value<toml::type_config> *in_stack_fffffffffffffac0;
  basic_value<toml::type_config> *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  value *in_stack_fffffffffffffad8;
  value *element;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  char *in_stack_fffffffffffffae8;
  allocator<char> *paVar8;
  basic_value<toml::type_config> *in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffb40;
  allocator<char> *paVar9;
  undefined7 in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb68;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_428;
  array_type *local_420;
  array_type *local_418;
  allocator<char> local_3f9 [48];
  allocator<char> local_3c9 [25];
  bool *in_stack_fffffffffffffc50;
  __sv_type in_stack_fffffffffffffc58;
  allocator<char> local_379 [39];
  byte local_352;
  allocator<char> local_351 [40];
  undefined1 local_329;
  undefined8 local_328;
  undefined8 uStack_320;
  allocator<char> local_311 [97];
  reference local_2b0;
  basic_value<toml::type_config> *local_2a8;
  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
  local_2a0;
  string *in_stack_fffffffffffffd68;
  allocator<char> local_271 [33];
  MessageFederate *local_250;
  allocator<char> local_241 [40];
  allocator<char> local_219 [39];
  byte local_1f2;
  allocator<char> local_1f1 [40];
  undefined1 local_1c9;
  
  toml::basic_value<toml::type_config>::basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffffab0);
  fileops::loadToml(in_stack_fffffffffffffd68);
  toml::basic_value<toml::type_config>::operator=
            (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffffab0);
  local_1c9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  fileops::replaceIfMember<bool>
            ((value *)in_stack_fffffffffffffc58._M_str,(string *)in_stack_fffffffffffffc58._M_len,
             in_stack_fffffffffffffc50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  bVar1 = fileops::getOrDefault
                    ((value *)in_stack_fffffffffffffab0,
                     (string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),false);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(local_219);
  local_1f2 = bVar1 & 1;
  paVar8 = local_241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  bVar2 = fileops::isMember((value *)in_stack_fffffffffffffc58._M_str,
                            (string *)in_stack_fffffffffffffc58._M_len);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(local_241);
  if ((bVar2 & 1) != 0) {
    paVar9 = local_271;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    this_00 = (MessageFederate *)
              toml::find<toml::type_config>
                        ((basic_value<toml::type_config> *)in_stack_fffffffffffffab0,
                         (key_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
    std::allocator<char>::~allocator(local_271);
    local_250 = this_00;
    bVar3 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x2aad29);
    if (!bVar3) {
      uVar4 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffac0,
                 (char *)in_stack_fffffffffffffab8);
      message._M_str = (char *)in_stack_fffffffffffffad0;
      message._M_len = (size_t)in_stack_fffffffffffffac8;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffffac0,message);
      __cxa_throw(uVar4,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    toml::basic_value<toml::type_config>::as_array(in_stack_fffffffffffffaf0);
    local_2a0._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_2a8 = (basic_value<toml::type_config> *)
                std::
                vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                       *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    while (bVar3 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffffab0,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8)),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      local_2b0 = __gnu_cxx::
                  __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                  ::operator*(&local_2a0);
      fileops::getName_abi_cxx11_(in_stack_fffffffffffffad8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
      local_328 = 0;
      uStack_320 = 0;
      defVal._M_len._7_1_ = in_stack_fffffffffffffae7;
      defVal._M_len._0_7_ = in_stack_fffffffffffffae0;
      defVal._M_str = in_stack_fffffffffffffae8;
      fileops::getOrDefault(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,defVal);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      std::allocator<char>::~allocator(local_311);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
      bVar3 = fileops::getOrDefault
                        ((value *)in_stack_fffffffffffffab0,
                         (string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                         false);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      std::allocator<char>::~allocator(local_351);
      local_329 = bVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                 (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
      bVar3 = fileops::getOrDefault
                        ((value *)in_stack_fffffffffffffab0,
                         (string *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),
                         false);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      std::allocator<char>::~allocator(local_379);
      local_352 = bVar3;
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      in_stack_fffffffffffffc58 =
           std::__cxx11::string::operator_cast_to_basic_string_view
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffab0);
      in_stack_fffffffffffffaa8 = local_352 & 1;
      eptName_00._M_str._0_7_ = in_stack_fffffffffffffb68;
      eptName_00._M_len = (size_t)paVar8;
      eptName_00._M_str._7_1_ = bVar1;
      type_00._M_str._0_7_ = in_stack_fffffffffffffb58;
      type_00._M_len = (size_t)paVar9;
      type_00._M_str._7_1_ = bVar2;
      in_stack_fffffffffffffaf0 =
           (basic_value<toml::type_config> *)
           registerEndpoint(this_00,eptName_00,type_00,
                            SUB81((ulong)in_stack_fffffffffffffb40 >> 0x38,0),
                            SUB81((ulong)in_stack_fffffffffffffb40 >> 0x30,0));
      loadOptions<toml::basic_value<toml::type_config>>
                (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_2a0);
    }
  }
  paVar8 = local_3c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffaf0,(char *)paVar8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  bVar1 = fileops::isMember((value *)in_stack_fffffffffffffc58._M_str,
                            (string *)in_stack_fffffffffffffc58._M_len);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffab0);
  std::allocator<char>::~allocator(local_3c9);
  if ((bVar1 & 1) != 0) {
    element = (value *)local_3f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffaf0,(char *)paVar8,
               (allocator<char> *)CONCAT17(bVar1,in_stack_fffffffffffffae0));
    peVar5 = toml::find<toml::type_config>
                       ((basic_value<toml::type_config> *)in_stack_fffffffffffffab0,
                        (key_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffab0);
    std::allocator<char>::~allocator(local_3f9);
    local_3f9._33_8_ = peVar5;
    bVar3 = toml::basic_value<toml::type_config>::is_array
                      ((basic_value<toml::type_config> *)0x2ab3f9);
    if (!bVar3) {
      sVar6 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffac0,
                 (char *)in_stack_fffffffffffffab8);
      message_00._M_str = (char *)peVar5;
      message_00._M_len = sVar6;
      InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_fffffffffffffac0,message_00);
      __cxa_throw(sVar6,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
    }
    paVar7 = toml::basic_value<toml::type_config>::as_array(in_stack_fffffffffffffaf0);
    local_420 = paVar7;
    local_418 = paVar7;
    local_428._M_current =
         (basic_value<toml::type_config> *)
         std::
         vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
         ::begin((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                  *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::
    vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
    ::end((vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
           *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    while (bVar3 = __gnu_cxx::
                   operator==<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                             ((__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)in_stack_fffffffffffffab0,
                              (__normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8)),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator*(&local_428);
      fileops::getName_abi_cxx11_(element);
      std::__cxx11::string::operator_cast_to_basic_string_view
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      sinkName._M_str = (char *)paVar7;
      sinkName._M_len = (size_t)in_stack_fffffffffffffab8;
      in_stack_fffffffffffffab8 = registerDataSink(in_stack_fffffffffffffab0,sinkName);
      loadOptions<toml::basic_value<toml::type_config>>
                (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffab0);
      __gnu_cxx::
      __normal_iterator<toml::basic_value<toml::type_config>_*,_std::vector<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>_>
      ::operator++(&local_428);
    }
  }
  toml::basic_value<toml::type_config>::~basic_value
            ((basic_value<toml::type_config> *)in_stack_fffffffffffffab0);
  return;
}

Assistant:

void MessageFederate::registerMessageInterfacesToml(const std::string& tomlString)
{
    toml::value doc;
    try {
        doc = fileops::loadToml(tomlString);
    }
    catch (const std::invalid_argument& ia) {
        throw(helics::InvalidParameter(ia.what()));
    }
    bool defaultGlobal = false;
    fileops::replaceIfMember(doc, "defaultglobal", defaultGlobal);
    const bool defaultTargeted = fileops::getOrDefault(doc, "targeted", false);
    if (fileops::isMember(doc, "endpoints")) {
        auto& epts = toml::find(doc, "endpoints");
        if (!epts.is_array()) {
            throw(helics::InvalidParameter("endpoints section in toml file must be an array"));
        }
        auto& eptArray = epts.as_array();
        for (auto& ept : eptArray) {
            auto eptName = fileops::getName(ept);
            auto type = fileops::getOrDefault(ept, "type", emptyStr);
            const bool global = fileops::getOrDefault(ept, "global", defaultGlobal);
            const bool targeted = fileops::getOrDefault(ept, "targeted", defaultTargeted);
            Endpoint& epObj = registerEndpoint(eptName, type, global, targeted);

            loadOptions(this, ept, epObj);
        }
    }
    if (fileops::isMember(doc, "datasinks")) {
        auto& epts = toml::find(doc, "datasinks");
        if (!epts.is_array()) {
            throw(helics::InvalidParameter("datasinks section in toml file must be an array"));
        }
        auto& eptArray = epts.as_array();
        for (auto& ept : eptArray) {
            auto key = fileops::getName(ept);
            Endpoint& epObj = registerDataSink(key);

            loadOptions(this, ept, epObj);
        }
    }
}